

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thingdef_properties.cpp
# Opt level: O2

void Handler_bouncetype_S_Actor(AActor *defaults,PClassActor *info,Baggage *bag,FPropParam *params)

{
  byte *pbVar1;
  char *in;
  undefined2 uVar2;
  uint uVar3;
  
  in = params[1].s;
  uVar3 = MatchString(in,Handler_bouncetype_S_Actor::names);
  if ((int)uVar3 < 0) {
    uVar3 = 0;
    I_Error("Unknown bouncetype %s",in);
  }
  uVar2 = (defaults->BounceFlags).Value & 0xef10 | (short)Handler_bouncetype_S_Actor::flags[uVar3];
  (defaults->BounceFlags).Value = uVar2;
  if ((uVar2 & (BOUNCE_AllActors|BOUNCE_Actors)) != BOUNCE_None) {
    pbVar1 = (byte *)((long)&(defaults->flags2).Value + 1);
    *pbVar1 = *pbVar1 | 0x10;
  }
  return;
}

Assistant:

DEFINE_PROPERTY(bouncetype, S, Actor)
{
	static const char *names[] = { "None", "Doom", "Heretic", "Hexen", "DoomCompat", "HereticCompat", "HexenCompat", "Grenade", "Classic", NULL };
	static const ActorBounceFlag flags[] = { BOUNCE_None,
		BOUNCE_Doom, BOUNCE_Heretic, BOUNCE_Hexen,
		BOUNCE_DoomCompat, BOUNCE_HereticCompat, BOUNCE_HexenCompat,
		BOUNCE_Grenade, BOUNCE_Classic, };
	PROP_STRING_PARM(id, 0);
	int match = MatchString(id, names);
	if (match < 0)
	{
		I_Error("Unknown bouncetype %s", id);
		match = 0;
	}
	defaults->BounceFlags &= ~(BOUNCE_TypeMask | BOUNCE_UseSeeSound);
	defaults->BounceFlags |= flags[match];
	if (defaults->BounceFlags & (BOUNCE_Actors | BOUNCE_AllActors))
	{
		// PASSMOBJ is irrelevant for normal missiles, but not for bouncers.
		defaults->flags2 |= MF2_PASSMOBJ;
	}
}